

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void iqnet::ssl::throw_io_exception(SSL *ssl,int ret)

{
  uint uVar1;
  connection_close *pcVar2;
  need_read *this;
  need_write *this_00;
  network_error *this_01;
  exception *this_02;
  io_error *this_03;
  allocator<char> local_51;
  string local_50;
  byte local_19;
  int local_18;
  int iStack_14;
  bool clean;
  int code;
  int ret_local;
  SSL *ssl_local;
  
  iStack_14 = ret;
  _code = (SSL *)ssl;
  local_18 = SSL_get_error((SSL *)ssl,ret);
  switch(local_18) {
  case 0:
    return;
  case 1:
    this_02 = (exception *)__cxa_allocate_exception(0x30);
    exception::exception(this_02);
    __cxa_throw(this_02,&exception::typeinfo,exception::~exception);
  case 2:
    this = (need_read *)__cxa_allocate_exception(0x30);
    need_read::need_read(this);
    __cxa_throw(this,&need_read::typeinfo,need_read::~need_read);
  case 3:
    this_00 = (need_write *)__cxa_allocate_exception(0x30);
    need_write::need_write(this_00);
    __cxa_throw(this_00,&need_write::typeinfo,need_write::~need_write);
  default:
    this_03 = (io_error *)__cxa_allocate_exception(0x30);
    io_error::io_error(this_03,local_18);
    __cxa_throw(this_03,&io_error::typeinfo,io_error::~io_error);
  case 5:
    break;
  case 6:
    uVar1 = SSL_get_shutdown(_code);
    local_19 = (byte)((uVar1 & 2) >> 1);
    pcVar2 = (connection_close *)__cxa_allocate_exception(0x38);
    connection_close::connection_close(pcVar2,(bool)(local_19 & 1));
    __cxa_throw(pcVar2,&connection_close::typeinfo,connection_close::~connection_close);
  }
  if (iStack_14 == 0) {
    pcVar2 = (connection_close *)__cxa_allocate_exception(0x38);
    connection_close::connection_close(pcVar2,false);
    __cxa_throw(pcVar2,&connection_close::typeinfo,connection_close::~connection_close);
  }
  this_01 = (network_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"iqnet::ssl::throw_io_exception",&local_51);
  network_error::network_error(this_01,&local_50,true,0);
  __cxa_throw(this_01,&network_error::typeinfo,network_error::~network_error);
}

Assistant:

void throw_io_exception( SSL* ssl, int ret )
{
  int code = SSL_get_error( ssl, ret );
  switch( code )
  {
    case SSL_ERROR_NONE:
      return;

    case SSL_ERROR_ZERO_RETURN:
    {
      bool clean = (SSL_get_shutdown(ssl) & SSL_RECEIVED_SHUTDOWN) != 0;
      throw connection_close( clean );
    }

    case SSL_ERROR_WANT_READ:
      throw need_read();

    case SSL_ERROR_WANT_WRITE:
      throw need_write();

    case SSL_ERROR_SYSCALL:
      if( !ret )
        throw connection_close( false );
      else
        throw iqnet::network_error( "iqnet::ssl::throw_io_exception" );

    case SSL_ERROR_SSL:
      throw exception();

    default:
      throw io_error( code );
  }
}